

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O2

void __thiscall
capnp::compiler::CompilerMain::setRootType(kj::StringPtr)::CliArgumentErrorReporter::
addError(unsigned_int,unsigned_int,kj::StringPtr_
          (void *this,uint32_t startByte,uint32_t endByte,StringPtr message)

{
  undefined4 in_register_00000014;
  StringPtr *in_stack_ffffffffffffffb8;
  int local_40;
  uint32_t local_3c;
  Array<char> local_38;
  char *local_20;
  StringPtr *local_18;
  
  local_18 = (StringPtr *)message.content.size_;
  local_20 = message.content.ptr;
  local_3c = endByte;
  if (startByte < endByte) {
    local_40 = startByte + 1;
    kj::str<unsigned_int,char_const(&)[2],unsigned_int&,char_const(&)[3],kj::StringPtr&>
              ((String *)&local_38,(kj *)&local_40,(uint *)0x20ae24,(char (*) [2])&local_3c,
               (uint *)0x1e369c,(char (*) [3])&local_20,in_stack_ffffffffffffffb8);
    kj::_::NullableValue<kj::String>::emplace<kj::String>
              ((NullableValue<kj::String> *)((long)this + 8),(String *)&local_38);
  }
  else if (startByte == 0) {
    kj::str<kj::StringPtr&>
              ((String *)&local_38,(kj *)&local_20,
               (StringPtr *)CONCAT44(in_register_00000014,endByte));
    kj::_::NullableValue<kj::String>::emplace<kj::String>
              ((NullableValue<kj::String> *)((long)this + 8),(String *)&local_38);
  }
  else {
    local_40 = startByte + 1;
    kj::str<unsigned_int,char_const(&)[3],kj::StringPtr&>
              ((String *)&local_38,(kj *)&local_40,(uint *)0x1e369c,(char (*) [3])&local_20,local_18
              );
    kj::_::NullableValue<kj::String>::emplace<kj::String>
              ((NullableValue<kj::String> *)((long)this + 8),(String *)&local_38);
  }
  kj::Array<char>::~Array(&local_38);
  return;
}

Assistant:

void addError(uint32_t startByte, uint32_t endByte, kj::StringPtr message) override {
        if (startByte < endByte) {
          error = kj::str(startByte + 1, "-", endByte, ": ", message);
        } else if (startByte > 0) {
          error = kj::str(startByte + 1, ": ", message);
        } else {
          error = kj::str(message);
        }
      }